

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O1

void __thiscall senjo::TestCommandHandle::Execute(TestCommandHandle *this)

{
  byte bVar1;
  ChessEngine *pCVar2;
  TestCommandHandle *pTVar3;
  size_type sVar4;
  long lVar5;
  ulong uVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  FILE *__stream;
  char *pcVar11;
  undefined4 extraout_var;
  const_iterator cVar12;
  int *piVar13;
  long lVar14;
  Output *pOVar15;
  Output *pOVar16;
  bool bVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avoid;
  int seldepth;
  int depth;
  string bestmove;
  uint64_t time;
  uint64_t qnodes;
  uint64_t nodes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  best;
  MoveFinder moveFinder;
  char fen [16384];
  Output *local_41d8;
  int local_41d0;
  int local_41cc;
  Output local_41c8;
  int local_41c0;
  int local_41bc;
  int local_41b8;
  int local_41b4;
  TestCommandHandle *local_41b0;
  Output local_41a8;
  _Rb_tree_node_base local_41a0;
  long local_4180;
  int local_4178;
  int local_4174;
  int local_4170;
  int local_416c;
  undefined8 local_4168;
  double dStack_4160;
  string local_4158;
  double local_4138;
  double dStack_4130;
  long local_4120;
  long local_4118;
  ulong local_4110;
  FILE *local_4108;
  int local_40fc;
  long local_40f8;
  long local_40f0;
  long local_40e8;
  undefined1 local_40e0 [48];
  MoveFinder local_40b0;
  undefined1 local_4038 [16392];
  
  if ((this->super_BackgroundCommand).engine == (ChessEngine *)0x0) {
    Output::Output((Output *)local_4038,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Engine not set for \'test\' command",0x21);
  }
  else {
    if ((this->fileName)._M_string_length != 0) {
      local_416c = 0;
      local_4170 = 0;
      local_40e8 = 0;
      local_40f0 = 0;
      local_40f8 = 0;
      lVar14 = 0x4c;
      do {
        *(undefined8 *)((long)(local_40b0.board + -1) + lVar14) = 0x7800000078;
        *(undefined2 *)((long)(local_40b0.board + -2) + 4 + lVar14) = 0;
        lVar14 = lVar14 + 0xc;
      } while (lVar14 != 100);
      lVar14 = 100;
      do {
        *(undefined8 *)((long)(local_40b0.board + -1) + lVar14) = 0x7800000078;
        *(undefined2 *)((long)(local_40b0.board + -2) + 4 + lVar14) = 0;
        lVar14 = lVar14 + 0xc;
      } while (lVar14 != 0x7c);
      local_40b0.ep.sqr = 0x78;
      __stream = fopen((this->fileName)._M_dataplus._M_p,"r");
      if (__stream != (FILE *)0x0) {
        local_4108 = __stream;
        (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x1e])();
        (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x22])();
        local_41bc = -1;
        local_4120 = 0;
        local_4118 = 0;
        local_4110 = 0;
        local_41d0 = 0;
        local_41cc = 0;
        local_41b4 = -1;
        local_41c0 = 0;
        local_41b8 = 0;
        local_4168 = (double)((ulong)local_4168._4_4_ << 0x20);
        local_4178 = 0;
        local_4174 = 0;
        iVar10 = 0;
        local_41b0 = this;
LAB_001439df:
        pOVar16 = (Output *)local_4038;
        pcVar11 = fgets((char *)pOVar16,0x4000,__stream);
        if (pcVar11 != (char *)0x0) {
          local_41d8 = pOVar16;
          if (local_4038[0] != '\0') {
            pOVar16 = (Output *)(local_4038 + 1);
            cVar7 = local_4038[0];
            do {
              pOVar15 = pOVar16;
              iVar9 = isspace((int)cVar7);
              pOVar16 = pOVar15;
              if (iVar9 == 0) break;
              cVar7 = *(char *)&pOVar15->_vptr_Output;
              pOVar16 = (Output *)((long)&pOVar15->_vptr_Output + 1);
              local_41d8 = pOVar15;
            } while (cVar7 != '\0');
            pOVar16 = (Output *)((long)&pOVar16[-1]._vptr_Output + 7);
          }
          local_4168 = (double)CONCAT44(local_4168._4_4_,(int)local_4168 + 1);
          if ((*(char *)&pOVar16->_vptr_Output != '\0') &&
             (*(char *)&local_41d8->_vptr_Output != '#')) {
            local_4138 = (double)CONCAT44(local_4138._4_4_,iVar10 + 1);
            if (local_41b0->skipCount == 0 || local_41b0->skipCount <= iVar10) {
              Output::Output(&local_41a8,InfoPrefix);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"--- Test ",9);
              local_41d0 = local_41d0 + 1;
              std::ostream::operator<<((ostream *)&std::cout,local_41d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," at line ",9);
              std::ostream::operator<<((ostream *)&std::cout,(int)local_4168);
              local_40e0[0] = 0x20;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_40e0,1)
              ;
              Output::operator<<(&local_41a8,(char **)&local_41d8);
              Output::~Output(&local_41a8);
              pOVar16 = local_41d8;
              if (local_41d8 != (Output *)0x0) {
                do {
                  bVar1 = *(byte *)&pOVar16->_vptr_Output;
                  if (bVar1 < 0x20) {
                    if (bVar1 == 0) break;
                    if ((bVar1 == 10) || (bVar1 == 0xd)) goto LAB_00143b4f;
LAB_00143b3a:
                    iVar10 = isspace((int)(char)bVar1);
                    if (iVar10 != 0) {
                      *(char *)&pOVar16->_vptr_Output = ' ';
                    }
                  }
                  else if (bVar1 != 0x20) goto LAB_00143b3a;
                  pOVar16 = (Output *)((long)&pOVar16->_vptr_Output + 1);
                } while( true );
              }
              goto LAB_00143b53;
            }
            bVar17 = false;
            goto LAB_001441fe;
          }
          bVar17 = false;
          goto LAB_00144205;
        }
        goto LAB_00144219;
      }
      Output::Output(&local_41a8,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cannot open \'",0xd)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(this->fileName)._M_dataplus._M_p,
                 (this->fileName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\': ",3);
      piVar13 = __errno_location();
      local_40e0._0_8_ = strerror(*piVar13);
      Output::operator<<(&local_41a8,(char **)local_40e0);
      Output::~Output(&local_41a8);
      goto LAB_0014485d;
    }
    Output::Output((Output *)local_4038,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"FileName not set for \'test\' command",0x23);
  }
  Output::~Output((Output *)local_4038);
  return;
LAB_00143b4f:
  *(char *)&pOVar16->_vptr_Output = '\0';
LAB_00143b53:
  if (local_41d8 != (Output *)0x0) {
    cVar7 = *(char *)&local_41d8->_vptr_Output;
    while (cVar7 != '\0') {
      pOVar16 = (Output *)((long)&local_41d8->_vptr_Output + 1);
      iVar10 = isspace((int)cVar7);
      if (iVar10 == 0) break;
      local_41d8 = pOVar16;
      cVar7 = *(char *)&pOVar16->_vptr_Output;
    }
  }
  pCVar2 = (local_41b0->super_BackgroundCommand).engine;
  iVar10 = (*pCVar2->_vptr_ChessEngine[9])(pCVar2,local_41d8);
  bVar17 = true;
  if (((Output *)CONCAT44(extraout_var,iVar10) != (Output *)0x0) &&
     (bVar8 = MoveFinder::LoadFEN(&local_40b0,(char *)local_41d8), bVar8)) {
    local_41a0._M_color = _S_red;
    local_41a0._M_parent = (_Base_ptr)0x0;
    local_41a0._M_left = &local_41a0;
    local_4180 = 0;
    local_40e0._8_4_ = _S_red;
    local_40e0._16_8_ = (_Base_ptr)0x0;
    local_40e0._24_8_ = local_40e0 + 8;
    local_40e0._40_8_ = 0;
    local_41d8 = (Output *)CONCAT44(extraout_var,iVar10);
    local_41a0._M_right = local_41a0._M_left;
    local_40e0._32_8_ = local_40e0._24_8_;
    do {
      pOVar16 = local_41d8;
      if ((local_41d8 != (Output *)0x0) &&
         (cVar7 = *(char *)&local_41d8->_vptr_Output, cVar7 != '\0')) {
        pOVar16 = (Output *)((long)&local_41d8->_vptr_Output + 1);
        do {
          pOVar15 = pOVar16;
          iVar10 = isspace((int)cVar7);
          pOVar16 = pOVar15;
          if (iVar10 == 0) break;
          cVar7 = *(char *)&pOVar15->_vptr_Output;
          pOVar16 = (Output *)((long)&pOVar15->_vptr_Output + 1);
          local_41d8 = pOVar15;
        } while (cVar7 != '\0');
        pOVar16 = (Output *)((long)&pOVar16[-1]._vptr_Output + 7);
      }
      if (*(char *)&pOVar16->_vptr_Output == '\0') goto LAB_00143de3;
      pcVar11 = strchr((char *)local_41d8,0x3b);
      pOVar16 = local_41d8;
      if (pcVar11 != (char *)0x0) {
        *pcVar11 = '\0';
      }
      iVar10 = strncmp((char *)local_41d8,"am ",3);
      if (iVar10 == 0) {
        local_41d8 = (Output *)((long)&pOVar16->_vptr_Output + 3);
        do {
          pOVar16 = local_41d8;
          if ((local_41d8 != (Output *)0x0) &&
             (cVar7 = *(char *)&local_41d8->_vptr_Output, cVar7 != '\0')) {
            pOVar16 = (Output *)((long)&local_41d8->_vptr_Output + 1);
            do {
              pOVar15 = pOVar16;
              iVar10 = isspace((int)cVar7);
              pOVar16 = pOVar15;
              if (iVar10 == 0) break;
              cVar7 = *(char *)&pOVar15->_vptr_Output;
              pOVar16 = (Output *)((long)&pOVar15->_vptr_Output + 1);
              local_41d8 = pOVar15;
            } while (cVar7 != '\0');
            pOVar16 = (Output *)((long)&pOVar16[-1]._vptr_Output + 7);
          }
          if (*(char *)&pOVar16->_vptr_Output == '\0') break;
          MoveFinder::ToCoordinates_abi_cxx11_(&local_4158,&local_40b0,(char **)&local_41d8);
          sVar4 = local_4158._M_string_length;
          if (local_4158._M_string_length != 0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_41a8,&local_4158);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4158._M_dataplus._M_p != &local_4158.field_2) {
            operator_delete(local_4158._M_dataplus._M_p);
          }
        } while (sVar4 != 0);
      }
      else {
        iVar10 = strncmp((char *)pOVar16,"bm ",3);
        if (iVar10 == 0) {
          local_41d8 = (Output *)((long)&pOVar16->_vptr_Output + 3);
          do {
            pOVar16 = local_41d8;
            if ((local_41d8 != (Output *)0x0) &&
               (cVar7 = *(char *)&local_41d8->_vptr_Output, cVar7 != '\0')) {
              pOVar16 = (Output *)((long)&local_41d8->_vptr_Output + 1);
              do {
                pOVar15 = pOVar16;
                iVar10 = isspace((int)cVar7);
                pOVar16 = pOVar15;
                if (iVar10 == 0) break;
                cVar7 = *(char *)&pOVar15->_vptr_Output;
                pOVar16 = (Output *)((long)&pOVar15->_vptr_Output + 1);
                local_41d8 = pOVar15;
              } while (cVar7 != '\0');
              pOVar16 = (Output *)((long)&pOVar16[-1]._vptr_Output + 7);
            }
            if (*(char *)&pOVar16->_vptr_Output == '\0') break;
            MoveFinder::ToCoordinates_abi_cxx11_(&local_4158,&local_40b0,(char **)&local_41d8);
            sVar4 = local_4158._M_string_length;
            if (local_4158._M_string_length != 0) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_40e0,&local_4158);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4158._M_dataplus._M_p != &local_4158.field_2) {
              operator_delete(local_4158._M_dataplus._M_p);
            }
          } while (sVar4 != 0);
        }
      }
      if ((pcVar11 == (char *)0x0) ||
         (local_41d8 = (Output *)(pcVar11 + 1), local_41d8 == (Output *)0x0)) goto LAB_00143de3;
    } while( true );
  }
LAB_001441fe:
  iVar10 = local_4138._0_4_;
LAB_00144205:
  __stream = local_4108;
  if (bVar17) goto LAB_00144219;
  goto LAB_001439df;
LAB_00143de3:
  pTVar3 = local_41b0;
  if (local_40e0._40_8_ == 0 && local_4180 == 0) {
    Output::Output((Output *)&local_4158,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"error at line ",0xe);
    std::ostream::operator<<((ostream *)&std::cout,(int)local_4168);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", no best or avoid moves specified",0x22);
    Output::~Output((Output *)&local_4158);
    bVar17 = true;
  }
  else {
    if (local_41b0->noClear == false) {
      (*((local_41b0->super_BackgroundCommand).engine)->_vptr_ChessEngine[0xe])();
    }
    if (pTVar3->printBoard == true) {
      (*((pTVar3->super_BackgroundCommand).engine)->_vptr_ChessEngine[0xc])();
    }
    ChessEngine::Go(&local_4158,(pTVar3->super_BackgroundCommand).engine,pTVar3->maxDepth,0,
                    pTVar3->maxTime,0,0,0,0,(string *)0x0);
    Output::Output(&local_41c8,NoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bestmove ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_4158._M_dataplus._M_p,local_4158._M_string_length);
    Output::~Output(&local_41c8);
    pCVar2 = (pTVar3->super_BackgroundCommand).engine;
    (*pCVar2->_vptr_ChessEngine[0x10])
              (pCVar2,&local_416c,&local_4170,&local_40e8,&local_40f0,&local_40f8,0,0,0);
    if (((local_4158._M_string_length == 0) ||
        ((local_40e0._40_8_ != 0 &&
         (cVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_40e0,&local_4158), cVar12._M_node == (_Base_ptr)(local_40e0 + 8))
         ))) || ((local_4180 != 0 &&
                 (cVar12 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_41a8,&local_4158), cVar12._M_node != &local_41a0)))) {
      Output::Output(&local_41c8,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--- FAILED! line ",0x11);
      std::ostream::operator<<((ostream *)&std::cout,(int)local_4168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
      dVar18 = 0.0;
      if (local_41d0 != 0) {
        dVar18 = ((double)local_41cc / (double)local_41d0) * 100.0;
      }
      std::ostream::_M_insert<double>(dVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%) ",3);
      Output::operator<<(&local_41c8,(char **)&local_41d8);
    }
    else {
      Output::Output(&local_41c8,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--- Passed. line ",0x11);
      std::ostream::operator<<((ostream *)&std::cout,(int)local_4168);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
      local_41cc = local_41cc + 1;
      dVar18 = 0.0;
      if (local_41d0 != 0) {
        dVar18 = ((double)local_41cc / (double)local_41d0) * 100.0;
      }
      std::ostream::_M_insert<double>(dVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%) ",3);
      Output::operator<<(&local_41c8,(char **)&local_41d8);
    }
    Output::~Output(&local_41c8);
    iVar10 = local_4170;
    if (local_41b8 < local_416c) {
      local_41b8 = local_416c;
    }
    iVar9 = local_41b4;
    if (local_416c < local_41b4) {
      iVar9 = local_416c;
    }
    bVar17 = local_41b4 < 0;
    local_40fc = local_416c;
    local_41b4 = iVar9;
    if (bVar17) {
      local_41b4 = local_416c;
    }
    if (local_41c0 < local_4170) {
      local_41c0 = local_4170;
    }
    iVar9 = local_41bc;
    if (local_4170 < local_41bc) {
      iVar9 = local_4170;
    }
    bVar17 = local_41bc < 0;
    local_41bc = iVar9;
    if (bVar17) {
      local_41bc = local_4170;
    }
    local_4110 = local_4110 + local_40e8;
    local_4118 = local_4118 + local_40f0;
    local_4120 = local_4120 + local_40f8;
    iVar9 = (*((local_41b0->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x20])();
    bVar17 = true;
    if ((char)iVar9 == '\0') {
      bVar17 = local_41b0->maxCount <= local_41d0 && local_41b0->maxCount != 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4158._M_dataplus._M_p != &local_4158.field_2) {
      operator_delete(local_4158._M_dataplus._M_p);
    }
    local_4174 = local_4174 + local_40fc;
    local_4178 = local_4178 + iVar10;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_41a8);
  goto LAB_001441fe;
LAB_00144219:
  Output::Output(&local_41a8,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- Completed ",0xe);
  uVar6 = local_4110;
  lVar5 = local_4118;
  lVar14 = local_4120;
  pTVar3 = local_41b0;
  iVar10 = local_41d0;
  std::ostream::operator<<((ostream *)&std::cout,local_41d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," test positions",0xf);
  Output::~Output(&local_41a8);
  Output::Output(&local_41a8,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- Passed    ",0xe);
  std::ostream::operator<<((ostream *)&std::cout,local_41cc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," passed (",9);
  dVar18 = 0.0;
  if (iVar10 != 0) {
    dVar18 = ((double)local_41cc / (double)iVar10) * 100.0;
  }
  std::ostream::_M_insert<double>(dVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%)",2);
  Output::~Output(&local_41a8);
  Output::Output(&local_41a8,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- Time      ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
  auVar19._8_4_ = (int)((ulong)lVar14 >> 0x20);
  auVar19._0_8_ = lVar14;
  auVar19._12_4_ = 0x45300000;
  dStack_4130 = auVar19._8_8_ - 1.9342813113834067e+25;
  local_4138 = dStack_4130 + ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0);
  auVar20._8_4_ = iVar10 >> 0x1f;
  auVar20._0_8_ = (long)iVar10;
  auVar20._12_4_ = 0x45300000;
  dStack_4160 = auVar20._8_8_ - 1.9342813113834067e+25;
  local_4168 = dStack_4160 + ((double)CONCAT44(0x43300000,iVar10) - 4503599627370496.0);
  dVar18 = 0.0;
  if (iVar10 != 0) {
    dVar18 = local_4138 / local_4168;
  }
  std::ostream::_M_insert<double>(dVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," avg)",5);
  Output::~Output(&local_41a8);
  Output::Output(&local_41a8,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- Nodes     ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
  dVar18 = 0.0;
  if (lVar14 != 0) {
    dVar18 = ((double)(uVar6 / 1000) / local_4138) * 1000.0;
  }
  std::ostream::_M_insert<double>(dVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," KNodes/sec",0xb);
  Output::~Output(&local_41a8);
  Output::Output(&local_41a8,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- QNodes    ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
  dVar18 = 0.0;
  if (uVar6 != 0) {
    auVar23._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar23._0_8_ = lVar5;
    auVar23._12_4_ = 0x45300000;
    auVar24._8_4_ = (int)(uVar6 >> 0x20);
    auVar24._0_8_ = uVar6;
    auVar24._12_4_ = 0x45300000;
    dVar18 = (((auVar23._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
             ((auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0))) * 100.0;
  }
  std::ostream::_M_insert<double>(dVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%)",2);
  Output::~Output(&local_41a8);
  Output::Output(&local_41a8,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- Depth     ",0xe);
  std::ostream::operator<<((ostream *)&std::cout,local_41b4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," min, ",6);
  auVar21._8_4_ = local_4174 >> 0x1f;
  auVar21._0_8_ = (long)local_4174;
  auVar21._12_4_ = 0x45300000;
  iVar9 = (int)(((auVar21._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,local_4174) - 4503599627370496.0)) / local_4168);
  if (iVar10 == 0) {
    iVar9 = 0;
  }
  std::ostream::operator<<((ostream *)&std::cout,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," avg, ",6);
  std::ostream::operator<<((ostream *)&std::cout,local_41b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," max",4);
  Output::~Output(&local_41a8);
  Output::Output(&local_41a8,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- SelDepth  ",0xe);
  std::ostream::operator<<((ostream *)&std::cout,local_41bc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," min, ",6);
  auVar22._8_4_ = local_4178 >> 0x1f;
  auVar22._0_8_ = (long)local_4178;
  auVar22._12_4_ = 0x45300000;
  iVar9 = (int)(((auVar22._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,local_4178) - 4503599627370496.0)) / local_4168);
  if (iVar10 == 0) {
    iVar9 = 0;
  }
  std::ostream::operator<<((ostream *)&std::cout,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," avg, ",6);
  std::ostream::operator<<((ostream *)&std::cout,local_41c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," max",4);
  Output::~Output(&local_41a8);
  (*((pTVar3->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x23])();
LAB_0014485d:
  if ((__stream != (FILE *)0x0) && (__stream != (FILE *)0x0)) {
    fclose(__stream);
  }
  return;
}

Assistant:

void TestCommandHandle::Execute()
{
  if (!engine) {
    Output() << "Engine not set for 'test' command";
    return;
  }

  if (fileName.empty()) {
    Output() << "FileName not set for 'test' command";
    return;
  }

  char     fen[16384];
  int      depth = 0;
  int      line = 0;
  int      maxSearchDepth = 0;
  int      maxSeldepth = 0;
  int      minSearchDepth = -1;
  int      minSeldepth = -1;
  int      passed = 0;
  int      positions = 0;
  int      seldepth = 0;
  int      tested = 0;
  int      totalDepth = 0;
  int      totalSeldepth = 0;
  uint64_t nodes = 0;
  uint64_t qnodes = 0;
  uint64_t time = 0;
  uint64_t totalNodes = 0;
  uint64_t totalQnodes = 0;
  uint64_t totalTime = 0;
  FILE*    fp = NULL;

  try {
    MoveFinder moveFinder;

    if (!(fp = fopen(fileName.c_str(), "r"))) {
      Output() << "Cannot open '" << fileName << "': " << strerror(errno);
      return;
    }

    engine->ClearStopFlags();
    engine->ResetStatsTotals();

    while (fgets(fen, sizeof(fen), fp)) {
      line++;

      char* f = fen;
      if (!*NextWord(f) || (*f == '#')) {
        continue;
      }

      positions++;
      if (skipCount && (positions <= skipCount)) {
        continue;
      }

      Output() << "--- Test " << (++tested) << " at line " << line << ' ' << f;
      NormalizeString(f);
      const char* next = engine->SetPosition(f);
      if (!next || !moveFinder.LoadFEN(f)) {
        break;
      }
      f += (next - f);

      // consume 'am' and 'bm' parameters
      std::set<std::string> avoid;
      std::set<std::string> best;
      while (f && *NextWord(f)) {
        // null terminate this parameter (parameters end with ; or end of line)
        char* end = strchr(f, ';');
        if (end) {
          *end = 0;
        }

        if (!strncmp(f, "am ", 3)) {
          f += 3;
          while (*NextWord(f)) {
            std::string coord = moveFinder.ToCoordinates(f);
            if (coord.size()) {
              avoid.insert(coord);
            }
            else {
              break;
            }
          }
        }
        else if (!strncmp(f, "bm ", 3)) {
          f += 3;
          while (*NextWord(f)) {
            std::string coord = moveFinder.ToCoordinates(f);
            if (coord.size()) {
              best.insert(coord);
            }
            else {
              break;
            }
          }
        }

        // move 'f' to beginning of next parameter
        if (end) {
          f = (end + 1);
          continue;
        }
        break;
      }

      if (avoid.empty() && best.empty()) {
        Output() << "error at line " << line
                 << ", no best or avoid moves specified";
        break;
      }

      if (!noClear) {
        engine->ClearSearchData();
      }
      if (printBoard) {
        engine->PrintBoard();
      }

      const std::string bestmove = engine->Go(maxDepth, 0, maxTime);
      Output(Output::NoPrefix) << "bestmove " << bestmove;

      engine->GetStats(&depth, &seldepth, &nodes, &qnodes, &time);
      if (bestmove.empty() ||
          (best.size() && !best.count(bestmove)) ||
          (avoid.size() && avoid.count(bestmove)))
      {
        Output() << "--- FAILED! line " << line << " ("
                 << Percent(passed, tested) << "%) " << f;
      }
      else {
        passed++;
        Output() << "--- Passed. line " << line << " ("
                 << Percent(passed, tested) << "%) " << f;
      }

      if (depth > maxSearchDepth) {
        maxSearchDepth = depth;
      }
      if ((minSearchDepth < 0) || (depth < minSearchDepth)) {
        minSearchDepth = depth;
      }
      if (seldepth > maxSeldepth) {
        maxSeldepth = seldepth;
      }
      if ((minSeldepth < 0) || (seldepth < minSeldepth)) {
        minSeldepth = seldepth;
      }
      totalDepth += depth;
      totalNodes += nodes;
      totalQnodes += qnodes;
      totalSeldepth += seldepth;
      totalTime += time;

      if (engine->StopRequested() || (maxCount && (tested >= maxCount))) {
        break;
      }
    }

    Output() << "--- Completed " << tested << " test positions";
    Output() << "--- Passed    " << passed << " passed ("
             << Percent(passed, tested) << "%)";
    Output() << "--- Time      " << totalTime << " ("
             << Average(totalTime, static_cast<uint64_t>(tested)) << " avg)";
    Output() << "--- Nodes     " << totalNodes << ", "
             << Rate((totalNodes / 1000), totalTime) << " KNodes/sec";
    Output() << "--- QNodes    " << totalQnodes << " ("
             << Percent(totalQnodes, totalNodes) << "%)";
    Output() << "--- Depth     " << minSearchDepth << " min, "
             << static_cast<int>(Average(totalDepth, tested)) << " avg, "
             << maxSearchDepth << " max";
    Output() << "--- SelDepth  " << minSeldepth << " min, "
             << static_cast<int>(Average(totalSeldepth, tested)) << " avg, "
             << maxSeldepth << " max";

    engine->ShowStatsTotals();
  }
  catch (const std::exception& e) {
    Output() << "ERROR: " << e.what();
  }
  catch (...) {
    Output() << "Unknown error!";
  }

  if (fp) {
    fclose(fp);
    fp = NULL;
  }
}